

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O0

int __thiscall hierarchy_info::init(hierarchy_info *this,EVP_PKEY_CTX *ctx)

{
  hierarchy_info *phVar1;
  kmp_uint32 *pkVar2;
  uint in_EDX;
  bool bVar3;
  kmp_uint32 i_3;
  kmp_uint32 i_2;
  kmp_uint32 d;
  kmp_uint32 branch;
  int i_1;
  kmp_uint32 i;
  kmp_int8 bool_result;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  kmp_uint32 local_20;
  uint local_1c;
  
  LOCK();
  bVar3 = this->uninitialized == '\x01';
  if (bVar3) {
    this->uninitialized = '\x02';
  }
  UNLOCK();
  if (bVar3) {
    this->depth = 1;
    this->resizing = '\0';
    this->maxLevels = 7;
    pkVar2 = (kmp_uint32 *)
             ___kmp_allocate(CONCAT17(in_stack_ffffffffffffffc7,
                                      CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0))
                            );
    this->numPerLevel = pkVar2;
    this->skipPerLevel = this->numPerLevel + this->maxLevels;
    for (local_1c = 0; local_1c < this->maxLevels; local_1c = local_1c + 1) {
      this->numPerLevel[local_1c] = 1;
      this->skipPerLevel[local_1c] = 1;
    }
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      *this->numPerLevel = 4;
      this->numPerLevel[1] = in_EDX >> 2;
      if ((in_EDX & 3) != 0) {
        this->numPerLevel[1] = this->numPerLevel[1] + 1;
      }
    }
    else {
      qsort(ctx,(long)(int)in_EDX,0x10c,__kmp_affinity_cmp_Address_labels);
      deriveLevels(this,(AddrUnsPair *)ctx,in_EDX);
    }
    this->base_num_threads = in_EDX;
    local_20 = this->maxLevels;
    while (local_20 = local_20 - 1, -1 < (int)local_20) {
      if ((this->numPerLevel[(int)local_20] != 1) || (1 < this->depth)) {
        this->depth = this->depth + 1;
      }
    }
    local_24 = 4;
    if (*this->numPerLevel == 1) {
      local_24 = in_EDX >> 2;
    }
    if (local_24 < 4) {
      local_24 = 4;
    }
    for (local_28 = 0; local_28 < this->depth - 1; local_28 = local_28 + 1) {
      while( true ) {
        bVar3 = true;
        if ((this->numPerLevel[local_28] <= local_24) && (bVar3 = false, local_28 == 0)) {
          bVar3 = 4 < *this->numPerLevel;
        }
        if (!bVar3) break;
        if ((this->numPerLevel[local_28] & 1) != 0) {
          this->numPerLevel[local_28] = this->numPerLevel[local_28] + 1;
        }
        this->numPerLevel[local_28] = this->numPerLevel[local_28] >> 1;
        if (this->numPerLevel[local_28 + 1] == 1) {
          this->depth = this->depth + 1;
        }
        this->numPerLevel[local_28 + 1] = this->numPerLevel[local_28 + 1] << 1;
      }
      if ((*this->numPerLevel == 1) && (local_24 = local_24 >> 1, local_24 < 4)) {
        local_24 = 4;
      }
    }
    for (local_2c = 1; local_2c < this->depth; local_2c = local_2c + 1) {
      this->skipPerLevel[local_2c] =
           this->numPerLevel[local_2c - 1] * this->skipPerLevel[local_2c - 1];
    }
    for (local_30 = this->depth; local_30 < this->maxLevels; local_30 = local_30 + 1) {
      this->skipPerLevel[local_30] = this->skipPerLevel[local_30 - 1] << 1;
    }
    this->uninitialized = '\0';
    phVar1 = this;
  }
  else {
    while (phVar1 = (hierarchy_info *)(ulong)(uint)(int)this->uninitialized,
          (int)this->uninitialized != 0) {
      __kmp_x86_pause();
    }
  }
  return (int)phVar1;
}

Assistant:

void init(AddrUnsPair *adr2os, int num_addrs) {
    kmp_int8 bool_result = KMP_COMPARE_AND_STORE_ACQ8(
        &uninitialized, not_initialized, initializing);
    if (bool_result == 0) { // Wait for initialization
      while (TCR_1(uninitialized) != initialized)
        KMP_CPU_PAUSE();
      return;
    }
    KMP_DEBUG_ASSERT(bool_result == 1);

    /* Added explicit initialization of the data fields here to prevent usage of
       dirty value observed when static library is re-initialized multiple times
       (e.g. when non-OpenMP thread repeatedly launches/joins thread that uses
       OpenMP). */
    depth = 1;
    resizing = 0;
    maxLevels = 7;
    numPerLevel =
        (kmp_uint32 *)__kmp_allocate(maxLevels * 2 * sizeof(kmp_uint32));
    skipPerLevel = &(numPerLevel[maxLevels]);
    for (kmp_uint32 i = 0; i < maxLevels;
         ++i) { // init numPerLevel[*] to 1 item per level
      numPerLevel[i] = 1;
      skipPerLevel[i] = 1;
    }

    // Sort table by physical ID
    if (adr2os) {
      qsort(adr2os, num_addrs, sizeof(*adr2os),
            __kmp_affinity_cmp_Address_labels);
      deriveLevels(adr2os, num_addrs);
    } else {
      numPerLevel[0] = maxLeaves;
      numPerLevel[1] = num_addrs / maxLeaves;
      if (num_addrs % maxLeaves)
        numPerLevel[1]++;
    }

    base_num_threads = num_addrs;
    for (int i = maxLevels - 1; i >= 0;
         --i) // count non-empty levels to get depth
      if (numPerLevel[i] != 1 || depth > 1) // only count one top-level '1'
        depth++;

    kmp_uint32 branch = minBranch;
    if (numPerLevel[0] == 1)
      branch = num_addrs / maxLeaves;
    if (branch < minBranch)
      branch = minBranch;
    for (kmp_uint32 d = 0; d < depth - 1; ++d) { // optimize hierarchy width
      while (numPerLevel[d] > branch ||
             (d == 0 && numPerLevel[d] > maxLeaves)) { // max 4 on level 0!
        if (numPerLevel[d] & 1)
          numPerLevel[d]++;
        numPerLevel[d] = numPerLevel[d] >> 1;
        if (numPerLevel[d + 1] == 1)
          depth++;
        numPerLevel[d + 1] = numPerLevel[d + 1] << 1;
      }
      if (numPerLevel[0] == 1) {
        branch = branch >> 1;
        if (branch < 4)
          branch = minBranch;
      }
    }

    for (kmp_uint32 i = 1; i < depth; ++i)
      skipPerLevel[i] = numPerLevel[i - 1] * skipPerLevel[i - 1];
    // Fill in hierarchy in the case of oversubscription
    for (kmp_uint32 i = depth; i < maxLevels; ++i)
      skipPerLevel[i] = 2 * skipPerLevel[i - 1];

    uninitialized = initialized; // One writer
  }